

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gnuplot-iostream.h
# Opt level: O3

void __thiscall gnuplotio::Gnuplot::~Gnuplot(Gnuplot *this)

{
  ~Gnuplot(this,&VTT);
  std::ios_base::~ios_base((ios_base *)&this->field_0xc0);
  return;
}

Assistant:

~Gnuplot() {
        if(debug_messages) {
            std::cerr << "ending gnuplot session" << std::endl;
        }

        // FIXME - boost's close method calls close() on the file descriptor, but we need to
        // use sometimes use pclose instead.  For now, just skip calling boost's close and use
        // flush just in case.
        do_flush();
        // Wish boost had a pclose method...
        //close();

        fh_close();

        delete feedback;
    }